

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

http_content_type_t get_file_MIME_type(char *filename)

{
  int iVar1;
  char *__s1;
  int local_28;
  http_content_type_t local_24;
  int i;
  http_content_type_t mime;
  char *fileExtension;
  char *filename_local;
  
  __s1 = strrchr(filename,0x2e);
  if (__s1 != (char *)0x0) {
    local_24 = text_html;
    for (local_28 = 0; file_ext[local_28] != (char *)0x0; local_28 = local_28 + 1) {
      iVar1 = strncmp(__s1,file_ext[local_28],5);
      if (iVar1 == 0) {
        return local_24;
      }
      local_24 = local_24 + image_jpg;
    }
  }
  return INVALID_MIME;
}

Assistant:

http_content_type_t get_file_MIME_type(const char* filename)
{
  char *fileExtension;
  if ((fileExtension = strrchr(filename, '.')) == NULL)
    return INVALID_MIME;

  http_content_type_t mime = text_html;

  for (int i = 0; file_ext[i] != NULL; ++i, ++mime)
    if (!(strncmp(fileExtension, file_ext[i], 5)))
      return mime;
  return INVALID_MIME;

}